

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

rnndelem * copydelem(rnndelem *elem,char *file)

{
  int iVar1;
  uint64_t uVar2;
  rnnaccess rVar3;
  rnndelem *prVar4;
  char *pcVar5;
  rnndelem **pprVar6;
  rnndelem *prVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  
  prVar4 = (rnndelem *)calloc(0x110,1);
  prVar4->type = elem->type;
  pcVar5 = elem->name;
  prVar4->name = pcVar5;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = strdup(pcVar5);
    prVar4->name = pcVar5;
  }
  rVar3 = elem->access;
  prVar4->width = elem->width;
  prVar4->access = rVar3;
  uVar2 = elem->length;
  prVar4->offset = elem->offset;
  prVar4->length = uVar2;
  prVar4->stride = elem->stride;
  copyvarinfo(&prVar4->varinfo,&elem->varinfo);
  prVar4->file = file;
  copytypeinfo(&prVar4->typeinfo,&elem->typeinfo,file);
  if (0 < elem->subelemsnum) {
    iVar1 = prVar4->subelemsnum;
    iVar9 = prVar4->subelemsmax;
    lVar8 = 0;
    do {
      if ((long)iVar9 <= iVar1 + lVar8) {
        bVar10 = iVar9 == 0;
        iVar9 = iVar9 * 2;
        if (bVar10) {
          iVar9 = 0x10;
        }
        pprVar6 = (rnndelem **)realloc(prVar4->subelems,(long)iVar9 << 3);
        prVar4->subelems = pprVar6;
      }
      prVar7 = copydelem(elem->subelems[lVar8],file);
      prVar4->subelems[iVar1 + lVar8] = prVar7;
      lVar8 = lVar8 + 1;
    } while (lVar8 < elem->subelemsnum);
    prVar4->subelemsnum = iVar1 + (int)lVar8;
    prVar4->subelemsmax = iVar9;
  }
  return prVar4;
}

Assistant:

static struct rnndelem *copydelem (struct rnndelem *elem, char *file) {
	struct rnndelem *res = calloc (sizeof *res, 1);
	res->type = elem->type;
	res->name = elem->name;
	if (res->name)
		res->name = strdup(res->name);
	res->width = elem->width;
	res->access = elem->access;
	res->offset = elem->offset;
	res->length = elem->length;
	res->stride = elem->stride;
	copyvarinfo(&res->varinfo, &elem->varinfo);
	res->file = file;
	copytypeinfo(&res->typeinfo, &elem->typeinfo, file);
	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		ADDARRAY(res->subelems, copydelem(elem->subelems[i], file));
	return res;
}